

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O1

int __thiscall breakpoint_recorder::remove(breakpoint_recorder *this,char *__filename)

{
  char cVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [11];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  char *pcVar19;
  anon_union_8_1_a8a14541_for_iterator_1 aVar20;
  uint uVar21;
  char *pcVar22;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  anon_class_16_2_e8808096 __pred;
  iterator iVar23;
  
  __pred.id = (size_t)__filename;
  __pred.this = this;
  std::forward_list<breakpoint_recorder::breakpoint,std::allocator<breakpoint_recorder::breakpoint>>
  ::
  remove_if<breakpoint_recorder::remove(unsigned_long)::_lambda(breakpoint_recorder::breakpoint_const&)_1_>
            ((forward_list<breakpoint_recorder::breakpoint,std::allocator<breakpoint_recorder::breakpoint>>
              *)this,__pred);
  pcVar19 = (this->m_pending).
            super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
            .
            super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
            .ctrl_;
  aVar20 = (anon_union_8_1_a8a14541_for_iterator_1)
           (this->m_pending).
           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
           .
           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
           .slots_;
  cVar1 = *pcVar19;
  pcVar22 = pcVar19;
  while (cVar1 < -1) {
    iVar7 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                   CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                   CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                   CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar22 < (char)iVar7);
    in_XMM1_Bb = -(pcVar22[1] < (char)((uint)iVar7 >> 8));
    in_XMM1_Bc = -(pcVar22[2] < (char)((uint)iVar7 >> 0x10));
    in_XMM1_Bd = -(pcVar22[3] < (char)((uint)iVar7 >> 0x18));
    in_XMM1_Be = -(pcVar22[4] < (char)iVar8);
    in_XMM1_Bf = -(pcVar22[5] < (char)((uint)iVar8 >> 8));
    in_XMM1_Bg = -(pcVar22[6] < (char)((uint)iVar8 >> 0x10));
    in_XMM1_Bh = -(pcVar22[7] < (char)((uint)iVar8 >> 0x18));
    in_XMM1_Bi = -(pcVar22[8] < (char)iVar9);
    in_XMM1_Bj = -(pcVar22[9] < (char)((uint)iVar9 >> 8));
    in_XMM1_Bk = -(pcVar22[10] < (char)((uint)iVar9 >> 0x10));
    in_XMM1_Bl = -(pcVar22[0xb] < (char)((uint)iVar9 >> 0x18));
    in_XMM1_Bm = -(pcVar22[0xc] < (char)iVar10);
    in_XMM1_Bn = -(pcVar22[0xd] < (char)((uint)iVar10 >> 8));
    in_XMM1_Bo = -(pcVar22[0xe] < (char)((uint)iVar10 >> 0x10));
    in_XMM1_Bp = -(pcVar22[0xf] < (char)((uint)iVar10 >> 0x18));
    auVar3[1] = in_XMM1_Bb;
    auVar3[0] = in_XMM1_Ba;
    auVar3[2] = in_XMM1_Bc;
    auVar3[3] = in_XMM1_Bd;
    auVar3[4] = in_XMM1_Be;
    auVar3[5] = in_XMM1_Bf;
    auVar3[6] = in_XMM1_Bg;
    auVar3[7] = in_XMM1_Bh;
    auVar3[8] = in_XMM1_Bi;
    auVar3[9] = in_XMM1_Bj;
    auVar3[10] = in_XMM1_Bk;
    auVar3[0xb] = in_XMM1_Bl;
    auVar3[0xc] = in_XMM1_Bm;
    auVar3[0xd] = in_XMM1_Bn;
    auVar3[0xe] = in_XMM1_Bo;
    auVar3[0xf] = in_XMM1_Bp;
    auVar4[1] = in_XMM1_Bb;
    auVar4[0] = in_XMM1_Ba;
    auVar4[2] = in_XMM1_Bc;
    auVar4[3] = in_XMM1_Bd;
    auVar4[4] = in_XMM1_Be;
    auVar4[5] = in_XMM1_Bf;
    auVar4[6] = in_XMM1_Bg;
    auVar4[7] = in_XMM1_Bh;
    auVar4[8] = in_XMM1_Bi;
    auVar4[9] = in_XMM1_Bj;
    auVar4[10] = in_XMM1_Bk;
    auVar4[0xb] = in_XMM1_Bl;
    auVar4[0xc] = in_XMM1_Bm;
    auVar4[0xd] = in_XMM1_Bn;
    auVar4[0xe] = in_XMM1_Bo;
    auVar4[0xf] = in_XMM1_Bp;
    auVar17[1] = in_XMM1_Bd;
    auVar17[0] = in_XMM1_Bc;
    auVar17[2] = in_XMM1_Be;
    auVar17[3] = in_XMM1_Bf;
    auVar17[4] = in_XMM1_Bg;
    auVar17[5] = in_XMM1_Bh;
    auVar17[6] = in_XMM1_Bi;
    auVar17[7] = in_XMM1_Bj;
    auVar17[8] = in_XMM1_Bk;
    auVar17[9] = in_XMM1_Bl;
    auVar17[10] = in_XMM1_Bm;
    auVar17[0xb] = in_XMM1_Bn;
    auVar17[0xc] = in_XMM1_Bo;
    auVar17[0xd] = in_XMM1_Bp;
    auVar15[1] = in_XMM1_Be;
    auVar15[0] = in_XMM1_Bd;
    auVar15[2] = in_XMM1_Bf;
    auVar15[3] = in_XMM1_Bg;
    auVar15[4] = in_XMM1_Bh;
    auVar15[5] = in_XMM1_Bi;
    auVar15[6] = in_XMM1_Bj;
    auVar15[7] = in_XMM1_Bk;
    auVar15[8] = in_XMM1_Bl;
    auVar15[9] = in_XMM1_Bm;
    auVar15[10] = in_XMM1_Bn;
    auVar15[0xb] = in_XMM1_Bo;
    auVar15[0xc] = in_XMM1_Bp;
    auVar13[1] = in_XMM1_Bf;
    auVar13[0] = in_XMM1_Be;
    auVar13[2] = in_XMM1_Bg;
    auVar13[3] = in_XMM1_Bh;
    auVar13[4] = in_XMM1_Bi;
    auVar13[5] = in_XMM1_Bj;
    auVar13[6] = in_XMM1_Bk;
    auVar13[7] = in_XMM1_Bl;
    auVar13[8] = in_XMM1_Bm;
    auVar13[9] = in_XMM1_Bn;
    auVar13[10] = in_XMM1_Bo;
    auVar13[0xb] = in_XMM1_Bp;
    auVar11[1] = in_XMM1_Bg;
    auVar11[0] = in_XMM1_Bf;
    auVar11[2] = in_XMM1_Bh;
    auVar11[3] = in_XMM1_Bi;
    auVar11[4] = in_XMM1_Bj;
    auVar11[5] = in_XMM1_Bk;
    auVar11[6] = in_XMM1_Bl;
    auVar11[7] = in_XMM1_Bm;
    auVar11[8] = in_XMM1_Bn;
    auVar11[9] = in_XMM1_Bo;
    auVar11[10] = in_XMM1_Bp;
    uVar21 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar17 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar15 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar13 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar11 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar2 = 0;
    if (uVar21 != 0) {
      for (; (uVar21 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    aVar20.slot_ = (slot_type *)((long)aVar20.slot_ + (ulong)(uVar2 * 0x30));
    cVar1 = pcVar22[uVar2];
    pcVar22 = pcVar22 + uVar2;
  }
  pcVar19 = pcVar19 + (this->m_pending).
                      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
                      .
                      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
                      .capacity_;
  do {
    if (pcVar22 == pcVar19) {
LAB_0012c8fd:
      return (int)pcVar19;
    }
    if ((char *)((pair<unsigned_long,_bool> *)((long)aVar20.slot_ + 0x20))->first == __filename) {
      if (pcVar22 != pcVar19) {
        iVar23.field_1.slot_ = aVar20.slot_;
        iVar23.ctrl_ = pcVar22;
        iVar23 = phmap::priv::
                 raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
                 ::erase((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
                          *)&this->m_pending,iVar23);
        return (int)iVar23.ctrl_;
      }
      goto LAB_0012c8fd;
    }
    aVar20.slot_ = aVar20.slot_ + 1;
    cVar1 = pcVar22[1];
    pcVar22 = pcVar22 + 1;
    while (cVar1 < -1) {
      iVar7 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                     CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                     CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                     CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar22 < (char)iVar7);
      in_XMM1_Bb = -(pcVar22[1] < (char)((uint)iVar7 >> 8));
      in_XMM1_Bc = -(pcVar22[2] < (char)((uint)iVar7 >> 0x10));
      in_XMM1_Bd = -(pcVar22[3] < (char)((uint)iVar7 >> 0x18));
      in_XMM1_Be = -(pcVar22[4] < (char)iVar8);
      in_XMM1_Bf = -(pcVar22[5] < (char)((uint)iVar8 >> 8));
      in_XMM1_Bg = -(pcVar22[6] < (char)((uint)iVar8 >> 0x10));
      in_XMM1_Bh = -(pcVar22[7] < (char)((uint)iVar8 >> 0x18));
      in_XMM1_Bi = -(pcVar22[8] < (char)iVar9);
      in_XMM1_Bj = -(pcVar22[9] < (char)((uint)iVar9 >> 8));
      in_XMM1_Bk = -(pcVar22[10] < (char)((uint)iVar9 >> 0x10));
      in_XMM1_Bl = -(pcVar22[0xb] < (char)((uint)iVar9 >> 0x18));
      in_XMM1_Bm = -(pcVar22[0xc] < (char)iVar10);
      in_XMM1_Bn = -(pcVar22[0xd] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bo = -(pcVar22[0xe] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bp = -(pcVar22[0xf] < (char)((uint)iVar10 >> 0x18));
      auVar5[1] = in_XMM1_Bb;
      auVar5[0] = in_XMM1_Ba;
      auVar5[2] = in_XMM1_Bc;
      auVar5[3] = in_XMM1_Bd;
      auVar5[4] = in_XMM1_Be;
      auVar5[5] = in_XMM1_Bf;
      auVar5[6] = in_XMM1_Bg;
      auVar5[7] = in_XMM1_Bh;
      auVar5[8] = in_XMM1_Bi;
      auVar5[9] = in_XMM1_Bj;
      auVar5[10] = in_XMM1_Bk;
      auVar5[0xb] = in_XMM1_Bl;
      auVar5[0xc] = in_XMM1_Bm;
      auVar5[0xd] = in_XMM1_Bn;
      auVar5[0xe] = in_XMM1_Bo;
      auVar5[0xf] = in_XMM1_Bp;
      auVar6[1] = in_XMM1_Bb;
      auVar6[0] = in_XMM1_Ba;
      auVar6[2] = in_XMM1_Bc;
      auVar6[3] = in_XMM1_Bd;
      auVar6[4] = in_XMM1_Be;
      auVar6[5] = in_XMM1_Bf;
      auVar6[6] = in_XMM1_Bg;
      auVar6[7] = in_XMM1_Bh;
      auVar6[8] = in_XMM1_Bi;
      auVar6[9] = in_XMM1_Bj;
      auVar6[10] = in_XMM1_Bk;
      auVar6[0xb] = in_XMM1_Bl;
      auVar6[0xc] = in_XMM1_Bm;
      auVar6[0xd] = in_XMM1_Bn;
      auVar6[0xe] = in_XMM1_Bo;
      auVar6[0xf] = in_XMM1_Bp;
      auVar18[1] = in_XMM1_Bd;
      auVar18[0] = in_XMM1_Bc;
      auVar18[2] = in_XMM1_Be;
      auVar18[3] = in_XMM1_Bf;
      auVar18[4] = in_XMM1_Bg;
      auVar18[5] = in_XMM1_Bh;
      auVar18[6] = in_XMM1_Bi;
      auVar18[7] = in_XMM1_Bj;
      auVar18[8] = in_XMM1_Bk;
      auVar18[9] = in_XMM1_Bl;
      auVar18[10] = in_XMM1_Bm;
      auVar18[0xb] = in_XMM1_Bn;
      auVar18[0xc] = in_XMM1_Bo;
      auVar18[0xd] = in_XMM1_Bp;
      auVar16[1] = in_XMM1_Be;
      auVar16[0] = in_XMM1_Bd;
      auVar16[2] = in_XMM1_Bf;
      auVar16[3] = in_XMM1_Bg;
      auVar16[4] = in_XMM1_Bh;
      auVar16[5] = in_XMM1_Bi;
      auVar16[6] = in_XMM1_Bj;
      auVar16[7] = in_XMM1_Bk;
      auVar16[8] = in_XMM1_Bl;
      auVar16[9] = in_XMM1_Bm;
      auVar16[10] = in_XMM1_Bn;
      auVar16[0xb] = in_XMM1_Bo;
      auVar16[0xc] = in_XMM1_Bp;
      auVar14[1] = in_XMM1_Bf;
      auVar14[0] = in_XMM1_Be;
      auVar14[2] = in_XMM1_Bg;
      auVar14[3] = in_XMM1_Bh;
      auVar14[4] = in_XMM1_Bi;
      auVar14[5] = in_XMM1_Bj;
      auVar14[6] = in_XMM1_Bk;
      auVar14[7] = in_XMM1_Bl;
      auVar14[8] = in_XMM1_Bm;
      auVar14[9] = in_XMM1_Bn;
      auVar14[10] = in_XMM1_Bo;
      auVar14[0xb] = in_XMM1_Bp;
      auVar12[1] = in_XMM1_Bg;
      auVar12[0] = in_XMM1_Bf;
      auVar12[2] = in_XMM1_Bh;
      auVar12[3] = in_XMM1_Bi;
      auVar12[4] = in_XMM1_Bj;
      auVar12[5] = in_XMM1_Bk;
      auVar12[6] = in_XMM1_Bl;
      auVar12[7] = in_XMM1_Bm;
      auVar12[8] = in_XMM1_Bn;
      auVar12[9] = in_XMM1_Bo;
      auVar12[10] = in_XMM1_Bp;
      uVar21 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar18 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar16 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar14 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar12 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar2 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      aVar20.slot_ = (slot_type *)((long)aVar20.slot_ + (ulong)(uVar2 * 0x30));
      cVar1 = pcVar22[uVar2];
      pcVar22 = pcVar22 + uVar2;
    }
  } while( true );
}

Assistant:

void remove(std::size_t id)
	{
		m_breakpoints.remove_if([this, id](const breakpoint &b) -> bool {
			if (b.id == id && b.data.type() == typeid(cs::var))
				b.data.get<cs::var>().const_val<cs::callable>().get_raw_data().target<cs::function>()->set_debugger_state(
				    false);
			else if (b.id == id && b.data.type() == typeid(std::string))
				m_pending.erase(m_pending.find(b.data.get<std::string>()));
			return b.id == id;
		});
		auto it = m_pending.begin();
		for (; it != m_pending.end(); ++it)
			if (it->second.first == id)
				break;
		if (it != m_pending.end())
			m_pending.erase(it);
	}